

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::svgfooter_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_40);
  std::operator<<((ostream *)&this->field_0x270,"\n </g>\n</svg>\n");
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgfooter()  {
		tmp.str("");
		tmp << "\n </g>\n</svg>\n";
		return tmp.str();
	}